

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O3

uint32_t __thiscall
cppnet::BufferQueue::GetFreeMemoryBlock
          (BufferQueue *this,vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *block_vec,
          uint32_t size)

{
  pointer *ppIVar1;
  iterator iVar2;
  element_type *peVar3;
  ulong uVar4;
  uint32_t uVar5;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  uint32_t mem_len_2;
  uint32_t mem_len_1;
  void *mem_2;
  void *mem_1;
  uint32_t local_68;
  uint32_t local_64;
  Iovec local_60;
  uint32_t local_4c;
  void *local_48;
  void *local_40;
  BufferQueue *local_38;
  
  local_40 = (void *)0x0;
  local_48 = (void *)0x0;
  local_64 = 0;
  local_68 = 0;
  local_4c = size;
  std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::reserve(block_vec,8);
  this_00 = (this->_buffer_write).
            super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_38 = this;
  if (local_4c == 0) {
    p_Var6 = p_Var7;
    if (this_00 == (element_type *)0x0) {
      (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])(this);
      this_00 = (this->_buffer_list)._tail.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = (this->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if (this_00 == (element_type *)0x0) {
        uVar5 = 0;
        p_Var7 = p_Var6;
        goto LAB_00111a59;
      }
    }
    uVar5 = 0;
    do {
      BufferBlock::GetFreeMemoryBlock(this_00,&local_40,&local_64,&local_48,&local_68);
      uVar4 = (ulong)local_64;
      if (uVar4 != 0) {
        local_60._iov_base = local_40;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60._iov_len = uVar4;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_60);
        }
        else {
          (iVar2._M_current)->_iov_base = local_40;
          (iVar2._M_current)->_iov_len = uVar4;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar5 = uVar5 + local_64;
      }
      uVar4 = (ulong)local_68;
      if (uVar4 != 0) {
        local_60._iov_base = local_48;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60._iov_len = uVar4;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_60);
        }
        else {
          (iVar2._M_current)->_iov_base = local_48;
          (iVar2._M_current)->_iov_len = uVar4;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar5 = uVar5 + local_68;
      }
      peVar3 = (local_38->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (local_38->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      p_Var7 = p_Var6;
      if (this_00 == peVar3) break;
      peVar3 = (this_00->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (this_00->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      p_Var6 = p_Var7;
      this_00 = peVar3;
    } while (peVar3 != (element_type *)0x0);
  }
  else {
    uVar5 = 0;
    do {
      p_Var6 = p_Var7;
      if (this_00 == (element_type *)0x0) {
        (*(local_38->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])();
        this_00 = (local_38->_buffer_list)._tail.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (local_38->_buffer_list)._tail.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
      }
      BufferBlock::GetFreeMemoryBlock(this_00,&local_40,&local_64,&local_48,&local_68);
      uVar4 = (ulong)local_64;
      if (uVar4 != 0) {
        local_60._iov_base = local_40;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60._iov_len = uVar4;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_60);
        }
        else {
          (iVar2._M_current)->_iov_base = local_40;
          (iVar2._M_current)->_iov_len = uVar4;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar5 = uVar5 + local_64;
      }
      uVar4 = (ulong)local_68;
      if (uVar4 != 0) {
        local_60._iov_base = local_48;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60._iov_len = uVar4;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_60);
        }
        else {
          (iVar2._M_current)->_iov_base = local_48;
          (iVar2._M_current)->_iov_len = uVar4;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar5 = uVar5 + local_68;
      }
      peVar3 = (this_00->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (this_00->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      this_00 = peVar3;
    } while (uVar5 < local_4c);
  }
LAB_00111a59:
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  return uVar5;
}

Assistant:

uint32_t BufferQueue::GetFreeMemoryBlock(std::vector<Iovec>& block_vec, uint32_t size) {
    void* mem_1 = nullptr;
    void* mem_2 = nullptr;
    uint32_t mem_len_1 = 0;
    uint32_t mem_len_2 = 0;

    block_vec.reserve(__block_vec_default_size);
    std::shared_ptr<BufferBlock> temp = _buffer_write;
    uint32_t cur_len = 0;
    if (size > 0) {
        while (cur_len < size) {
            if (temp == nullptr) {
                Append();
                temp = _buffer_list.GetTail();
            }
        
            temp->GetFreeMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
            if (mem_len_1 > 0) {
                block_vec.emplace_back(Iovec(mem_1, mem_len_1));
                cur_len += mem_len_1;
            }
            if (mem_len_2 > 0) {
                block_vec.emplace_back(Iovec(mem_2, mem_len_2));
                cur_len += mem_len_2;
            }
            temp = temp->GetNext();
        }

    } else {
        // add one block
        if (!temp) {
            Append();
            temp = _buffer_list.GetTail();
        }
        
        while (temp) {
            temp->GetFreeMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
            if (mem_len_1 > 0) {
                block_vec.emplace_back(Iovec(mem_1, mem_len_1));
                cur_len += mem_len_1;
            }
            if (mem_len_2 > 0) {
                block_vec.emplace_back(Iovec(mem_2, mem_len_2));
                cur_len += mem_len_2;
            }
            if (temp == _buffer_list.GetTail()) {
                break;
            }
            temp = temp->GetNext();
        }
    }
    return cur_len;
}